

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<void_(cv::Mat)>::ExplainMatchResultTo
          (TypedExpectation<void_(cv::Mat)> *this,ArgumentTuple *args,ostream *os)

{
  _Rb_tree_header *this_00;
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  undefined1 local_1e8 [8];
  ExpectationSet unsatisfied_prereqs;
  ios_base local_158 [264];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if (this[0x84] == (TypedExpectation<void_(cv::Mat)>)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"         Expected: the expectation is active\n",0x2d);
    pcVar6 = "           Actual: it is retired\n";
    lVar5 = 0x21;
LAB_0013b224:
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar5);
    return;
  }
  bVar1 = Matches(this,args);
  if (bVar1) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this);
    if (bVar1) {
      pcVar6 = "The call matches the expectation.\n";
      lVar5 = 0x22;
      goto LAB_0013b224;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"         Expected: all pre-requisites are satisfied\n",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"           Actual: the following immediate pre-requisites ",0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(os,"are not satisfied:\n",0x13);
    unsatisfied_prereqs.expectations_._M_t._M_impl._0_8_ =
         (ulong)(uint)unsatisfied_prereqs.expectations_._M_t._M_impl._4_4_ << 0x20;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Rb_tree_node_base *)&unsatisfied_prereqs;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Rb_tree_node_base *)&unsatisfied_prereqs;
    ExpectationBase::FindUnsatisfiedPrerequisites
              ((ExpectationBase *)this,(ExpectationSet *)local_1e8);
    if (unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Rb_tree_node_base *)&unsatisfied_prereqs) {
      iVar7 = 0;
      p_Var4 = unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      do {
        ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(p_Var4 + 1),os);
        std::__ostream_insert<char,std::char_traits<char>>(os,"pre-requisite #",0xf);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        iVar7 = iVar7 + 1;
      } while (p_Var4 != (_Rb_tree_node_base *)&unsatisfied_prereqs);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"                   (end of pre-requisites)\n",0x2b);
    std::
    _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
    ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                 *)local_1e8);
  }
  else {
    bVar1 = TuplePrefix<1ul>::Matches<std::tuple<testing::Matcher<cv::Mat>>,std::tuple<cv::Mat>>
                      ((tuple<testing::Matcher<cv::Mat>_> *)(this + 0xf0),args);
    if (!bVar1) {
      TuplePrefix<1ul>::
      ExplainMatchFailuresTo<std::tuple<testing::Matcher<cv::Mat>>,std::tuple<cv::Mat>>
                ((tuple<testing::Matcher<cv::Mat>_> *)(this + 0xf0),args,os);
    }
    this_00 = &unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header;
    unsatisfied_prereqs.expectations_._M_t._M_impl._0_8_ =
         &unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8 = (undefined1  [8])&PTR__StringMatchResultListener_001810e0;
    std::__cxx11::stringstream::stringstream((stringstream *)this_00);
    cVar2 = (**(code **)(**(long **)(this + 0x110) + 0x20))(*(long **)(this + 0x110),args,local_1e8)
    ;
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(os,"    Expected args: ",0x13);
      (**(code **)(**(long **)(this + 0x110) + 0x10))(*(long **)(this + 0x110),os);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,"\n           Actual: don\'t match",0x1f);
      std::__cxx11::stringbuf::str();
      iVar7 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar7 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
    }
    local_1e8 = (undefined1  [8])&PTR__StringMatchResultListener_001810e0;
    std::__cxx11::stringstream::~stringstream((stringstream *)this_00);
    std::ios_base::~ios_base(local_158);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }